

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O1

int32_t icu_63::CollationFastLatin::compareUTF8
                  (uint16_t *table,uint16_t *primaries,int32_t options,uint8_t *left,
                  int32_t leftLength,uint8_t *right,int32_t rightLength)

{
  uint16_t *table_00;
  byte bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int32_t *piVar9;
  long lVar10;
  uint uVar11;
  uint32_t uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  int32_t rightIndex;
  int32_t leftIndex;
  int32_t local_64;
  int32_t local_60;
  uint local_5c;
  int32_t *local_58;
  int local_4c;
  uint8_t *local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  table_00 = table + (byte)*table;
  local_5c = (uint)options >> 0x10;
  local_34 = options & 0xffff;
  uVar2 = 0;
  local_60 = 0;
  local_58 = &local_64;
  local_64 = 0;
  uVar12 = 0;
  local_4c = leftLength;
  local_48 = right;
  local_3c = options;
LAB_0022f588:
  do {
    if (uVar12 == 0) {
      if (local_60 == local_4c) {
        uVar12 = 2;
      }
      else {
        lVar10 = (long)local_60 + 1;
        iVar7 = (int)lVar10;
        bVar1 = left[local_60];
        lVar8 = (long)(char)bVar1;
        uVar11 = (uint)bVar1;
        if (lVar8 < 0) {
          if ((((byte)(bVar1 + 0x3a) < 0xfc) || (iVar7 == local_4c)) || (-0x41 < (char)left[lVar10])
             ) {
            local_60 = iVar7;
            uVar12 = lookupUTF8(table_00,(uint)bVar1,left,&local_60,local_4c);
          }
          else {
            local_60 = local_60 + 2;
            uVar11 = ((uint)bVar1 * 0x40 + (uint)left[lVar10]) - 0x3080;
            uVar12 = (uint32_t)primaries[uVar11];
            if (primaries[uVar11] != 0) goto LAB_0022f658;
            uVar12 = (uint32_t)table_00[uVar11];
          }
LAB_0022f63c:
          if (0xfff < uVar12) {
            uVar12 = uVar12 & 0xfc00;
            goto LAB_0022f658;
          }
          if (local_5c < uVar12) {
            uVar12 = uVar12 & 0xff8;
            goto LAB_0022f658;
          }
          uVar12 = nextPair(table_00,uVar11,uVar12,(UChar *)0x0,left,&local_60,&local_4c);
          if (uVar12 == 1) {
            local_58 = (int32_t *)0xfffffffe;
            uVar3 = 1;
            uVar12 = 1;
          }
          else {
            uVar11 = uVar12 & 0xffff;
            if (uVar11 < 0x1000) {
              if (uVar11 <= local_5c) {
                uVar3 = 0;
                if (0xbff < uVar11) {
                  uVar12 = uVar3;
                }
                goto LAB_0022f65d;
              }
              uVar12 = uVar12 & 0xfff8fff8;
            }
            else {
              uVar12 = uVar12 & 0xfc00fc00;
            }
            uVar3 = 0;
          }
        }
        else {
          uVar12 = (uint32_t)primaries[lVar8];
          local_60 = iVar7;
          if (primaries[lVar8] == 0) {
            if (((local_3c & 2) == 0) || ((byte)(bVar1 - 0x3a) < 0xf6)) {
              uVar12 = (uint32_t)table_00[lVar8];
              goto LAB_0022f63c;
            }
            local_58 = (int32_t *)0xfffffffe;
            uVar3 = 1;
            uVar12 = 0;
            goto LAB_0022f65d;
          }
LAB_0022f658:
          uVar3 = 5;
        }
LAB_0022f65d:
        if (uVar3 == 0) goto LAB_0022f588;
        if (uVar3 != 5) goto LAB_002300e8;
      }
    }
    do {
      if (uVar2 != 0) goto LAB_0022f873;
      if (local_64 == rightLength) {
        uVar2 = 2;
        goto LAB_0022f873;
      }
      lVar10 = (long)local_64 + 1;
      iVar7 = (int)lVar10;
      bVar1 = local_48[local_64];
      lVar8 = (long)(char)bVar1;
      uVar11 = (uint)bVar1;
      if (lVar8 < 0) {
        if ((((byte)(bVar1 + 0x3a) < 0xfc) || (iVar7 == rightLength)) ||
           (-0x41 < (char)local_48[lVar10])) {
          local_64 = iVar7;
          uVar2 = lookupUTF8(table_00,(uint)bVar1,local_48,&local_64,rightLength);
        }
        else {
          local_64 = local_64 + 2;
          uVar11 = ((uint)bVar1 * 0x40 + (uint)local_48[lVar10]) - 0x3080;
          uVar2 = (uint32_t)primaries[uVar11];
          if (primaries[uVar11] != 0) goto LAB_0022f842;
          uVar2 = (uint32_t)table_00[uVar11];
        }
LAB_0022f81e:
        if (0xfff < uVar2) {
          uVar2 = uVar2 & 0xfc00;
          goto LAB_0022f842;
        }
        if (local_5c < uVar2) {
          uVar2 = uVar2 & 0xff8;
          goto LAB_0022f842;
        }
        uVar2 = nextPair(table_00,uVar11,uVar2,(UChar *)0x0,local_48,&local_64,&rightLength);
        if (uVar2 == 1) {
          local_58 = (int32_t *)0xfffffffe;
          uVar3 = 1;
          uVar2 = 1;
        }
        else {
          uVar11 = uVar2 & 0xffff;
          if (uVar11 < 0x1000) {
            if (uVar11 <= local_5c) {
              uVar3 = 0;
              if (0xbff < uVar11) {
                uVar2 = uVar3;
              }
              goto LAB_0022f847;
            }
            uVar2 = uVar2 & 0xfff8fff8;
          }
          else {
            uVar2 = uVar2 & 0xfc00fc00;
          }
          uVar3 = 0;
        }
      }
      else {
        uVar2 = (uint32_t)primaries[lVar8];
        local_64 = iVar7;
        if (primaries[lVar8] == 0) {
          if (((local_3c & 2) == 0) || ((byte)(bVar1 - 0x3a) < 0xf6)) {
            uVar2 = (uint32_t)table_00[lVar8];
            goto LAB_0022f81e;
          }
          local_58 = (int32_t *)0xfffffffe;
          uVar3 = 1;
          uVar2 = 0;
          goto LAB_0022f847;
        }
LAB_0022f842:
        uVar3 = 7;
      }
LAB_0022f847:
    } while (uVar3 == 0);
    if (uVar3 != 7) goto LAB_002300e8;
LAB_0022f873:
    if (uVar12 != uVar2) {
      if ((uVar12 & 0xffff) == (uVar2 & 0xffff)) {
        iVar7 = 2;
        if (uVar12 == 2) {
          uVar12 = 2;
        }
        else {
          uVar12 = uVar12 >> 0x10;
          uVar2 = uVar2 >> 0x10;
          iVar7 = 0;
        }
      }
      else {
        local_58 = (int32_t *)(ulong)(-(uint)((uVar12 & 0xffff) < (uVar2 & 0xffff)) | 1);
        iVar7 = 1;
      }
      if (iVar7 != 0) {
        if (iVar7 != 2) goto LAB_002300e8;
        break;
      }
      goto LAB_0022f588;
    }
    uVar2 = 0;
    bVar14 = uVar12 != 2;
    uVar12 = 0;
  } while (bVar14);
  if (0xfff < local_34) {
    uVar12 = 0;
    local_64 = 0;
    local_60 = 0;
    uVar2 = 0;
LAB_0022f92d:
    do {
      uVar11 = local_5c;
      if (uVar2 == 0) {
        lVar8 = (long)local_60;
        if (local_60 == local_4c) {
          uVar2 = 2;
        }
        else {
          bVar1 = left[lVar8];
          if ((long)(char)bVar1 < 0) {
            if (bVar1 < 0xc6) {
              local_60 = local_60 + 2;
              uVar5 = (uint)table_00[(ulong)((uint)left[lVar8 + 1] + (uint)bVar1 * 0x40) - 0x3080];
            }
            else {
              local_60 = local_60 + 3;
              if (bVar1 == 0xe2) {
                uVar5 = (uint)table_00[(ulong)left[lVar8 + 2] + 0x100];
              }
              else {
                uVar5 = 0xfca8;
                if (left[lVar8 + 2] == 0xbe) {
                  uVar5 = 3;
                }
              }
            }
          }
          else {
            uVar5 = (uint)table_00[(char)bVar1];
            local_60 = local_60 + 1;
          }
          if (uVar5 < 0x1000) {
            if (local_5c < uVar5) {
              uVar2 = 0xc0;
              goto LAB_0022f9f4;
            }
            uVar2 = nextPair(table_00,(uint)bVar1,uVar5,(UChar *)0x0,left,&local_60,&local_4c);
            uVar2 = getSecondaries(uVar11,uVar2);
            bVar14 = true;
          }
          else {
            uVar5 = uVar5 & 0x3e0;
            uVar2 = uVar5 * 0x10000 + 0x2000c0;
            if (uVar5 < 0x180) {
              uVar2 = uVar5 + 0x20;
            }
LAB_0022f9f4:
            bVar14 = false;
          }
          if (bVar14) goto LAB_0022f92d;
        }
      }
      do {
        uVar11 = local_5c;
        if (uVar12 != 0) break;
        lVar8 = (long)local_64;
        if (local_64 == rightLength) {
          uVar12 = 2;
          break;
        }
        bVar1 = local_48[lVar8];
        if ((long)(char)bVar1 < 0) {
          if (bVar1 < 0xc6) {
            local_64 = local_64 + 2;
            uVar5 = (uint)table_00[(ulong)((uint)local_48[lVar8 + 1] + (uint)bVar1 * 0x40) - 0x3080]
            ;
          }
          else {
            local_64 = local_64 + 3;
            if (bVar1 == 0xe2) {
              uVar5 = (uint)table_00[(ulong)local_48[lVar8 + 2] + 0x100];
            }
            else {
              uVar5 = 0xfca8;
              if (local_48[lVar8 + 2] == 0xbe) {
                uVar5 = 3;
              }
            }
          }
        }
        else {
          uVar5 = (uint)table_00[(char)bVar1];
          local_64 = local_64 + 1;
        }
        if (uVar5 < 0x1000) {
          if (local_5c < uVar5) {
            uVar12 = 0xc0;
            goto LAB_0022faff;
          }
          uVar12 = nextPair(table_00,(uint)bVar1,uVar5,(UChar *)0x0,local_48,&local_64,&rightLength)
          ;
          uVar12 = getSecondaries(uVar11,uVar12);
          bVar14 = true;
        }
        else {
          uVar5 = uVar5 & 0x3e0;
          uVar12 = uVar5 * 0x10000 + 0x2000c0;
          if (uVar5 < 0x180) {
            uVar12 = uVar5 + 0x20;
          }
LAB_0022faff:
          bVar14 = false;
        }
      } while (bVar14);
      if (uVar2 != uVar12) {
        if ((uVar2 & 0xffff) == (uVar12 & 0xffff)) {
          if (uVar2 == 2) {
            uVar2 = 2;
            iVar7 = 8;
          }
          else {
            uVar2 = uVar2 >> 0x10;
            uVar12 = uVar12 >> 0x10;
            iVar7 = 0;
          }
        }
        else {
          local_58 = (int32_t *)0xfffffffe;
          iVar7 = 1;
          if ((local_3c >> 0xb & 1) == 0) {
            local_58 = (int32_t *)(ulong)(-(uint)((uVar2 & 0xffff) < (uVar12 & 0xffff)) | 1);
          }
        }
        if (iVar7 != 0) {
          if (iVar7 != 8) goto LAB_002300e8;
          break;
        }
        goto LAB_0022f92d;
      }
      uVar12 = 0;
      bVar14 = uVar2 != 2;
      uVar2 = 0;
    } while (bVar14);
  }
  if ((local_3c >> 10 & 1) == 0) {
    local_38 = (uint)local_58;
  }
  else {
    bVar14 = local_34 < 0x1000;
    uVar13 = 0;
    local_64 = 0;
    local_60 = 0;
    uVar12 = 0;
    uVar2 = local_5c;
joined_r0x0022fbf1:
    do {
      local_5c = uVar2;
      if (uVar12 == 0) {
        lVar8 = (long)local_60;
        if (local_60 != local_4c) {
          bVar1 = left[lVar8];
          if ((long)(char)bVar1 < 0) {
            if (bVar1 < 0xc6) {
              local_60 = local_60 + 2;
              uVar12 = (uint32_t)
                       table_00[(ulong)((uint)left[lVar8 + 1] + (uint)bVar1 * 0x40) - 0x3080];
            }
            else {
              local_60 = local_60 + 3;
              if (bVar1 == 0xe2) {
                uVar12 = (uint32_t)table_00[(ulong)left[lVar8 + 2] + 0x100];
              }
              else {
                uVar12 = 0xfca8;
                if (left[lVar8 + 2] == 0xbe) {
                  uVar12 = 3;
                }
              }
            }
          }
          else {
            uVar12 = (uint32_t)table_00[(char)bVar1];
            local_60 = (int)(lVar8 + 1);
          }
          if (uVar12 < 0xc00) {
            uVar12 = nextPair(table_00,(uint)bVar1,uVar12,(UChar *)0x0,left,&local_60,&local_4c);
          }
          uVar12 = getCases(uVar2,bVar14,uVar12);
          uVar2 = local_5c;
          goto joined_r0x0022fbf1;
        }
        uVar12 = 2;
      }
      if ((int)uVar13 == 0) {
        do {
          lVar8 = (long)local_64;
          if (local_64 == rightLength) {
            uVar13 = 2;
            goto LAB_0022fda6;
          }
          bVar1 = local_48[lVar8];
          if ((long)(char)bVar1 < 0) {
            if (bVar1 < 0xc6) {
              local_64 = local_64 + 2;
              uVar2 = (uint32_t)
                      table_00[(ulong)((uint)local_48[lVar8 + 1] + (uint)bVar1 * 0x40) - 0x3080];
            }
            else {
              local_64 = local_64 + 3;
              if (bVar1 == 0xe2) {
                uVar2 = (uint32_t)table_00[(ulong)local_48[lVar8 + 2] + 0x100];
              }
              else {
                uVar2 = 0xfca8;
                if (local_48[lVar8 + 2] == 0xbe) {
                  uVar2 = 3;
                }
              }
            }
          }
          else {
            uVar2 = (uint32_t)table_00[(char)bVar1];
            local_64 = (int)(lVar8 + 1);
          }
          if (uVar2 < 0xc00) {
            uVar2 = nextPair(table_00,(uint)bVar1,uVar2,(UChar *)0x0,local_48,&local_64,&rightLength
                            );
          }
          uVar2 = getCases(local_5c,bVar14,uVar2);
        } while (uVar2 == 0);
        uVar13 = (ulong)uVar2;
      }
LAB_0022fda6:
      uVar2 = local_5c;
      if (uVar12 != (uint)uVar13) {
        uVar11 = uVar12 & 0xffff;
        uVar5 = (uint)uVar13 & 0xffff;
        if (uVar11 == uVar5) {
          iVar7 = 0;
          if (uVar12 == 2) {
            uVar12 = 2;
            iVar7 = 0xe;
            bVar15 = false;
          }
          else {
            uVar12 = uVar12 >> 0x10;
            uVar13 = uVar13 >> 0x10;
            bVar15 = true;
          }
        }
        else {
          if ((local_3c >> 8 & 1) == 0) {
            uVar11 = -(uint)(uVar11 < uVar5);
          }
          else {
            uVar11 = (uVar11 < uVar5) - 1;
          }
          bVar15 = false;
          local_58 = (int32_t *)(ulong)(uVar11 | 1);
          iVar7 = 1;
        }
        if (iVar7 != 0) {
          if (iVar7 != 0xe) goto LAB_0022fe33;
          break;
        }
        goto joined_r0x0022fbf1;
      }
      uVar13 = 0;
      bVar15 = uVar12 != 2;
      uVar12 = 0;
    } while (bVar15);
    bVar15 = true;
LAB_0022fe33:
    local_38 = (uint)local_58;
    if (!bVar15) goto LAB_002300e8;
  }
  if (0x1fff < local_34) {
    bVar14 = (local_3c & 0x600) == 0x200;
    uVar3 = 0;
    local_64 = 0;
    local_60 = 0;
    local_3c = local_3c & 0x700;
    uVar12 = 0;
    iVar7 = local_60;
    uVar2 = local_5c;
joined_r0x0022fe8e:
    do {
      iVar4 = local_64;
      local_60 = iVar7;
      local_5c = uVar2;
      if (uVar12 == 0) {
        lVar8 = (long)iVar7;
        if (iVar7 != local_4c) {
          local_60 = (int32_t)(lVar8 + 1);
          bVar1 = left[lVar8];
          if ((long)(char)bVar1 < 0) {
            if (bVar1 < 0xc6) {
              local_60 = iVar7 + 2;
              uVar12 = (uint32_t)
                       table_00[(ulong)((uint)left[lVar8 + 1] + (uint)bVar1 * 0x40) - 0x3080];
            }
            else {
              local_60 = iVar7 + 3;
              if (bVar1 == 0xe2) {
                uVar12 = (uint32_t)table_00[(ulong)left[lVar8 + 2] + 0x100];
              }
              else {
                uVar12 = 0xfca8;
                if (left[lVar8 + 2] == 0xbe) {
                  uVar12 = 3;
                }
              }
            }
          }
          else {
            uVar12 = (uint32_t)table_00[(char)bVar1];
          }
          if (uVar12 < 0xc00) {
            uVar12 = nextPair(table_00,(uint)bVar1,uVar12,(UChar *)0x0,left,&local_60,&local_4c);
          }
          uVar12 = getTertiaries(uVar2,bVar14,uVar12);
          iVar7 = local_60;
          uVar2 = local_5c;
          goto joined_r0x0022fe8e;
        }
        uVar12 = 2;
      }
      while (uVar3 == 0) {
        lVar8 = (long)iVar4;
        if (iVar4 == rightLength) {
          uVar3 = 2;
          break;
        }
        local_64 = (int32_t)(lVar8 + 1);
        bVar1 = local_48[lVar8];
        if ((long)(char)bVar1 < 0) {
          if (bVar1 < 0xc6) {
            local_64 = iVar4 + 2;
            uVar2 = (uint32_t)
                    table_00[(ulong)((uint)local_48[lVar8 + 1] + (uint)bVar1 * 0x40) - 0x3080];
          }
          else {
            local_64 = iVar4 + 3;
            if (bVar1 == 0xe2) {
              uVar2 = (uint32_t)table_00[(ulong)local_48[lVar8 + 2] + 0x100];
            }
            else {
              uVar2 = 0xfca8;
              if (local_48[lVar8 + 2] == 0xbe) {
                uVar2 = 3;
              }
            }
          }
        }
        else {
          uVar2 = (uint32_t)table_00[(char)bVar1];
        }
        if (uVar2 < 0xc00) {
          uVar2 = nextPair(table_00,(uint)bVar1,uVar2,(UChar *)0x0,local_48,&local_64,&rightLength);
        }
        uVar3 = getTertiaries(local_5c,bVar14,uVar2);
        iVar4 = local_64;
      }
      local_64 = iVar4;
      iVar7 = local_60;
      uVar2 = local_5c;
      if (uVar12 != uVar3) {
        uVar11 = uVar12 & 0xffff;
        uVar5 = uVar3 & 0xffff;
        if (uVar11 == uVar5) {
          if (uVar12 == 2) {
            uVar12 = 2;
            iVar4 = 0x14;
          }
          else {
            uVar12 = uVar12 >> 0x10;
            uVar3 = uVar3 >> 0x10;
            iVar4 = 0;
          }
        }
        else {
          if (local_3c == 0x300) {
            if (3 < uVar11) {
              uVar11 = uVar11 ^ 0x18;
            }
            if (3 < uVar5) {
              uVar5 = uVar5 ^ 0x18;
            }
          }
          local_38 = -(uint)(uVar11 < uVar5) | 1;
          iVar4 = 1;
        }
        if (iVar4 != 0) {
          if (iVar4 != 0x14) {
            local_58 = (int32_t *)(ulong)local_38;
            goto LAB_002300e8;
          }
          break;
        }
        goto joined_r0x0022fe8e;
      }
      uVar3 = 0;
      bVar15 = uVar12 != 2;
      uVar12 = 0;
    } while (bVar15);
    if (0x2fff < local_34) {
      local_64 = 0;
      local_58 = (int32_t *)0x0;
      local_60 = 0;
      uVar11 = 0;
LAB_00230120:
      do {
        piVar9 = local_58;
        if (uVar11 == 0) {
          lVar8 = (long)local_60;
          if (local_60 != local_4c) {
            bVar1 = left[lVar8];
            if ((long)(char)bVar1 < 0) {
              if (bVar1 < 0xc6) {
                local_60 = local_60 + 2;
                uVar5 = (uint)table_00[(ulong)((uint)left[lVar8 + 1] + (uint)bVar1 * 0x40) - 0x3080]
                ;
              }
              else {
                local_60 = local_60 + 3;
                if (bVar1 == 0xe2) {
                  uVar5 = (uint)table_00[(ulong)left[lVar8 + 2] + 0x100];
                }
                else {
                  uVar5 = 0xfca8;
                  if (left[lVar8 + 2] == 0xbe) {
                    uVar5 = 3;
                  }
                }
              }
            }
            else {
              uVar5 = (uint)table_00[(char)bVar1];
              local_60 = (int)(lVar8 + 1);
            }
            if (uVar5 < 0xc00) {
              uVar5 = nextPair(table_00,(uint)bVar1,uVar5,(UChar *)0x0,left,&local_60,&local_4c);
            }
            if (uVar5 < 0x10000) {
              if (uVar5 < 0x1000) {
                uVar11 = 0xfc00;
                if ((uVar5 <= local_5c) && (uVar11 = uVar5 & 0xff8, uVar5 < 0xc00)) {
                  uVar11 = uVar5;
                }
              }
              else {
                uVar11 = (uint)((uVar5 & 0x380) < 0x180) * 0x4000000 + 0xfc00fc00;
              }
            }
            else {
              uVar11 = uVar5 & 0xfff8fff8;
              if (local_5c < (uVar5 & 0xffff)) {
                uVar11 = 0xfc00fc00;
              }
            }
            goto LAB_00230120;
          }
          uVar11 = 2;
        }
        while ((int)piVar9 == 0) {
          lVar8 = (long)local_64;
          if (local_64 == rightLength) {
            piVar9 = (int32_t *)0x2;
            break;
          }
          bVar1 = local_48[lVar8];
          if ((long)(char)bVar1 < 0) {
            if (bVar1 < 0xc6) {
              local_64 = local_64 + 2;
              uVar5 = (uint)table_00[(ulong)((uint)local_48[lVar8 + 1] + (uint)bVar1 * 0x40) -
                                     0x3080];
            }
            else {
              local_64 = local_64 + 3;
              if (bVar1 == 0xe2) {
                uVar5 = (uint)table_00[(ulong)local_48[lVar8 + 2] + 0x100];
              }
              else {
                uVar5 = 0xfca8;
                if (local_48[lVar8 + 2] == 0xbe) {
                  uVar5 = 3;
                }
              }
            }
          }
          else {
            uVar5 = (uint)table_00[(char)bVar1];
            local_64 = (int)(lVar8 + 1);
          }
          if (uVar5 < 0xc00) {
            uVar5 = nextPair(table_00,(uint)bVar1,uVar5,(UChar *)0x0,local_48,&local_64,&rightLength
                            );
          }
          if (uVar5 < 0x10000) {
            if (uVar5 < 0x1000) {
              piVar9 = (int32_t *)0xfc00;
              if (uVar5 <= local_5c) {
                uVar6 = uVar5 & 0xff8;
                if (uVar5 < 0xc00) {
                  uVar6 = uVar5;
                }
                piVar9 = (int32_t *)(ulong)uVar6;
              }
            }
            else {
              piVar9 = (int32_t *)(ulong)((uint)((uVar5 & 0x380) < 0x180) * 0x4000000 + 0xfc00fc00);
            }
          }
          else {
            uVar6 = uVar5 & 0xfff8fff8;
            if (local_5c < (uVar5 & 0xffff)) {
              uVar6 = 0xfc00fc00;
            }
            piVar9 = (int32_t *)(ulong)uVar6;
          }
        }
        if (uVar11 != (uint)piVar9) {
          uVar5 = (uint)piVar9 & 0xffff;
          local_58 = piVar9;
          if ((uVar11 & 0xffff) == uVar5) {
            if (uVar11 == 2) {
              uVar11 = 2;
              iVar7 = 0x1a;
            }
            else {
              uVar11 = uVar11 >> 0x10;
              iVar7 = 0;
              local_58 = (int32_t *)((ulong)piVar9 >> 0x10 & 0xffff);
            }
          }
          else {
            local_38 = -(uint)((uVar11 & 0xffff) < uVar5) | 1;
            iVar7 = 1;
          }
          if (iVar7 != 0) {
            local_58 = (int32_t *)(ulong)local_38;
            if (iVar7 == 0x1a) goto LAB_002300df;
            break;
          }
          goto LAB_00230120;
        }
        local_58 = (int32_t *)0x0;
        bVar14 = uVar11 != 2;
        uVar11 = 0;
      } while (bVar14);
      goto LAB_002300e8;
    }
  }
LAB_002300df:
  local_58 = (int32_t *)0x0;
LAB_002300e8:
  return (int32_t)local_58;
}

Assistant:

int32_t
CollationFastLatin::compareUTF8(const uint16_t *table, const uint16_t *primaries, int32_t options,
                                 const uint8_t *left, int32_t leftLength,
                                 const uint8_t *right, int32_t rightLength) {
    // Keep compareUTF16() and compareUTF8() in sync very closely!

    U_ASSERT((table[0] >> 8) == VERSION);
    table += (table[0] & 0xff);  // skip the header
    uint32_t variableTop = (uint32_t)options >> 16;  // see RuleBasedCollator::getFastLatinOptions()
    options &= 0xffff;  // needed for CollationSettings::getStrength() to work

    // Check for supported characters, fetch mini CEs, and compare primaries.
    int32_t leftIndex = 0, rightIndex = 0;
    /**
     * Single mini CE or a pair.
     * The current mini CE is in the lower 16 bits, the next one is in the upper 16 bits.
     * If there is only one, then it is in the lower bits, and the upper bits are 0.
     */
    uint32_t leftPair = 0, rightPair = 0;
    // Note: There is no need to assemble the code point.
    // We only need to look up the table entry for the character,
    // and nextPair() looks for whether c==0.
    for(;;) {
        // We fetch CEs until we get a non-ignorable primary or reach the end.
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            uint8_t t;
            if(c <= 0x7f) {
                leftPair = primaries[c];
                if(leftPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                leftPair = table[c];
            } else if(c <= LATIN_MAX_UTF8_LEAD && 0xc2 <= c && leftIndex != leftLength &&
                    0x80 <= (t = left[leftIndex]) && t <= 0xbf) {
                ++leftIndex;
                c = ((c - 0xc2) << 6) + t;
                leftPair = primaries[c];
                if(leftPair != 0) { break; }
                leftPair = table[c];
            } else {
                leftPair = lookupUTF8(table, c, left, leftIndex, leftLength);
            }
            if(leftPair >= MIN_SHORT) {
                leftPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(leftPair > variableTop) {
                leftPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
                if(leftPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                leftPair = getPrimaries(variableTop, leftPair);
            }
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            uint8_t t;
            if(c <= 0x7f) {
                rightPair = primaries[c];
                if(rightPair != 0) { break; }
                if(c <= 0x39 && c >= 0x30 && (options & CollationSettings::NUMERIC) != 0) {
                    return BAIL_OUT_RESULT;
                }
                rightPair = table[c];
            } else if(c <= LATIN_MAX_UTF8_LEAD && 0xc2 <= c && rightIndex != rightLength &&
                    0x80 <= (t = right[rightIndex]) && t <= 0xbf) {
                ++rightIndex;
                c = ((c - 0xc2) << 6) + t;
                rightPair = primaries[c];
                if(rightPair != 0) { break; }
                rightPair = table[c];
            } else {
                rightPair = lookupUTF8(table, c, right, rightIndex, rightLength);
            }
            if(rightPair >= MIN_SHORT) {
                rightPair &= SHORT_PRIMARY_MASK;
                break;
            } else if(rightPair > variableTop) {
                rightPair &= LONG_PRIMARY_MASK;
                break;
            } else {
                rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
                if(rightPair == BAIL_OUT) { return BAIL_OUT_RESULT; }
                rightPair = getPrimaries(variableTop, rightPair);
            }
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftPrimary = leftPair & 0xffff;
        uint32_t rightPrimary = rightPair & 0xffff;
        if(leftPrimary != rightPrimary) {
            // Return the primary difference.
            return (leftPrimary < rightPrimary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    // In the following, we need to re-fetch each character because we did not buffer the CEs,
    // but we know that the string is well-formed and
    // only contains supported characters and mappings.

    // We might skip the secondary level but continue with the case level
    // which is turned on separately.
    if(CollationSettings::getStrength(options) >= UCOL_SECONDARY) {
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                if(c <= 0x7f) {
                    leftPair = table[c];
                } else if(c <= LATIN_MAX_UTF8_LEAD) {
                    leftPair = table[((c - 0xc2) << 6) + left[leftIndex++]];
                } else {
                    leftPair = lookupUTF8Unsafe(table, c, left, leftIndex);
                }
                if(leftPair >= MIN_SHORT) {
                    leftPair = getSecondariesFromOneShortCE(leftPair);
                    break;
                } else if(leftPair > variableTop) {
                    leftPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
                    leftPair = getSecondaries(variableTop, leftPair);
                }
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                if(c <= 0x7f) {
                    rightPair = table[c];
                } else if(c <= LATIN_MAX_UTF8_LEAD) {
                    rightPair = table[((c - 0xc2) << 6) + right[rightIndex++]];
                } else {
                    rightPair = lookupUTF8Unsafe(table, c, right, rightIndex);
                }
                if(rightPair >= MIN_SHORT) {
                    rightPair = getSecondariesFromOneShortCE(rightPair);
                    break;
                } else if(rightPair > variableTop) {
                    rightPair = COMMON_SEC_PLUS_OFFSET;
                    break;
                } else {
                    rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
                    rightPair = getSecondaries(variableTop, rightPair);
                }
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftSecondary = leftPair & 0xffff;
            uint32_t rightSecondary = rightPair & 0xffff;
            if(leftSecondary != rightSecondary) {
                if((options & CollationSettings::BACKWARD_SECONDARY) != 0) {
                    // Full support for backwards secondary requires backwards contraction matching
                    // and moving backwards between merge separators.
                    return BAIL_OUT_RESULT;
                }
                return (leftSecondary < rightSecondary) ? UCOL_LESS : UCOL_GREATER;
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }

    if((options & CollationSettings::CASE_LEVEL) != 0) {
        UBool strengthIsPrimary = CollationSettings::getStrength(options) == UCOL_PRIMARY;
        leftIndex = rightIndex = 0;
        leftPair = rightPair = 0;
        for(;;) {
            while(leftPair == 0) {
                if(leftIndex == leftLength) {
                    leftPair = EOS;
                    break;
                }
                UChar32 c = left[leftIndex++];
                leftPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, left, leftIndex);
                if(leftPair < MIN_LONG) {
                    leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
                }
                leftPair = getCases(variableTop, strengthIsPrimary, leftPair);
            }

            while(rightPair == 0) {
                if(rightIndex == rightLength) {
                    rightPair = EOS;
                    break;
                }
                UChar32 c = right[rightIndex++];
                rightPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, right, rightIndex);
                if(rightPair < MIN_LONG) {
                    rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
                }
                rightPair = getCases(variableTop, strengthIsPrimary, rightPair);
            }

            if(leftPair == rightPair) {
                if(leftPair == EOS) { break; }
                leftPair = rightPair = 0;
                continue;
            }
            uint32_t leftCase = leftPair & 0xffff;
            uint32_t rightCase = rightPair & 0xffff;
            if(leftCase != rightCase) {
                if((options & CollationSettings::UPPER_FIRST) == 0) {
                    return (leftCase < rightCase) ? UCOL_LESS : UCOL_GREATER;
                } else {
                    return (leftCase < rightCase) ? UCOL_GREATER : UCOL_LESS;
                }
            }
            if(leftPair == EOS) { break; }
            leftPair >>= 16;
            rightPair >>= 16;
        }
    }
    if(CollationSettings::getStrength(options) <= UCOL_SECONDARY) { return UCOL_EQUAL; }

    // Remove the case bits from the tertiary weight when caseLevel is on or caseFirst is off.
    UBool withCaseBits = CollationSettings::isTertiaryWithCaseBits(options);

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, left, leftIndex);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
            }
            leftPair = getTertiaries(variableTop, withCaseBits, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, right, rightIndex);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
            }
            rightPair = getTertiaries(variableTop, withCaseBits, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftTertiary = leftPair & 0xffff;
        uint32_t rightTertiary = rightPair & 0xffff;
        if(leftTertiary != rightTertiary) {
            if(CollationSettings::sortsTertiaryUpperCaseFirst(options)) {
                // Pass through EOS and MERGE_WEIGHT
                // and keep real tertiary weights larger than the MERGE_WEIGHT.
                // Tertiary CEs (secondary ignorables) are not supported in fast Latin.
                if(leftTertiary > MERGE_WEIGHT) {
                    leftTertiary ^= CASE_MASK;
                }
                if(rightTertiary > MERGE_WEIGHT) {
                    rightTertiary ^= CASE_MASK;
                }
            }
            return (leftTertiary < rightTertiary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    if(CollationSettings::getStrength(options) <= UCOL_TERTIARY) { return UCOL_EQUAL; }

    leftIndex = rightIndex = 0;
    leftPair = rightPair = 0;
    for(;;) {
        while(leftPair == 0) {
            if(leftIndex == leftLength) {
                leftPair = EOS;
                break;
            }
            UChar32 c = left[leftIndex++];
            leftPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, left, leftIndex);
            if(leftPair < MIN_LONG) {
                leftPair = nextPair(table, c, leftPair, NULL, left, leftIndex, leftLength);
            }
            leftPair = getQuaternaries(variableTop, leftPair);
        }

        while(rightPair == 0) {
            if(rightIndex == rightLength) {
                rightPair = EOS;
                break;
            }
            UChar32 c = right[rightIndex++];
            rightPair = (c <= 0x7f) ? table[c] : lookupUTF8Unsafe(table, c, right, rightIndex);
            if(rightPair < MIN_LONG) {
                rightPair = nextPair(table, c, rightPair, NULL, right, rightIndex, rightLength);
            }
            rightPair = getQuaternaries(variableTop, rightPair);
        }

        if(leftPair == rightPair) {
            if(leftPair == EOS) { break; }
            leftPair = rightPair = 0;
            continue;
        }
        uint32_t leftQuaternary = leftPair & 0xffff;
        uint32_t rightQuaternary = rightPair & 0xffff;
        if(leftQuaternary != rightQuaternary) {
            return (leftQuaternary < rightQuaternary) ? UCOL_LESS : UCOL_GREATER;
        }
        if(leftPair == EOS) { break; }
        leftPair >>= 16;
        rightPair >>= 16;
    }
    return UCOL_EQUAL;
}